

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFFormFieldObjectHelper::setV
          (QPDFFormFieldObjectHelper *this,QPDFObjectHandle *value,bool need_appearances)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *qpdf_00;
  QPDFAcroFormDocumentHelper local_218;
  allocator<char> local_1f1;
  string local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c0;
  QPDF *qpdf;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  QPDFObjectHandle local_160;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [24];
  string local_e8;
  undefined1 local_c8 [40];
  string local_a0;
  undefined1 local_80 [16];
  undefined1 local_70 [8];
  string name;
  bool okay;
  string local_40;
  byte local_19;
  QPDFObjectHandle *pQStack_18;
  bool need_appearances_local;
  QPDFObjectHandle *value_local;
  QPDFFormFieldObjectHelper *this_local;
  
  local_19 = need_appearances;
  pQStack_18 = value;
  value_local = (QPDFObjectHandle *)this;
  getFieldType_abi_cxx11_(&local_40,this);
  bVar1 = std::operator==(&local_40,"/Btn");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    bVar1 = isCheckbox(this);
    if (bVar1) {
      name.field_2._M_local_buf[0xb] = '\0';
      bVar1 = QPDFObjectHandle::isName(value);
      if (bVar1) {
        QPDFObjectHandle::getName_abi_cxx11_((string *)local_70,value);
        name.field_2._M_local_buf[0xb] = '\x01';
        bVar1 = std::operator!=((string *)local_70,"/Off");
        setCheckBoxValue(this,bVar1);
        std::__cxx11::string::~string((string *)local_70);
      }
      if ((name.field_2._M_local_buf[0xb] & 1U) == 0) {
        QPDFObjectHelper::oh((QPDFObjectHelper *)local_80);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,
                   "ignoring attempt to set a checkbox field to a value whose type is not name",
                   (allocator<char> *)(local_c8 + 0x27));
        QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_80,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)(local_c8 + 0x27));
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_80);
      }
    }
    else {
      bVar1 = isRadioButton(this);
      if (bVar1) {
        bVar1 = QPDFObjectHandle::isName(value);
        if (bVar1) {
          QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)(local_c8 + 0x10),value);
          setRadioButtonValue(this,(QPDFObjectHandle *)(local_c8 + 0x10));
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)(local_c8 + 0x10));
        }
        else {
          QPDFObjectHelper::oh((QPDFObjectHelper *)local_c8);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,
                     "ignoring attempt to set a radio button field to an object that is not a name",
                     (allocator<char> *)(local_100 + 0x17));
          QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_c8,&local_e8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::allocator<char>::~allocator((allocator<char> *)(local_100 + 0x17));
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c8);
        }
      }
      else {
        bVar1 = isPushbutton(this);
        if (bVar1) {
          QPDFObjectHelper::oh((QPDFObjectHelper *)local_100);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_120,"ignoring attempt set the value of a pushbutton field",
                     &local_121);
          QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)local_100,&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::allocator<char>::~allocator(&local_121);
          QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_100);
        }
      }
    }
  }
  else {
    bVar1 = QPDFObjectHandle::isString(value);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"/V",&local_149);
      QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_180,value);
      QPDFObjectHandle::newUnicodeString(&local_160,&local_180);
      setFieldAttribute(this,&local_148,&local_160);
      QPDFObjectHandle::~QPDFObjectHandle(&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"/V",&local_1a1);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&qpdf,value);
      setFieldAttribute(this,&local_1a0,(QPDFObjectHandle *)&qpdf);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&qpdf);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator(&local_1a1);
    }
    if ((local_19 & 1) != 0) {
      QPDFObjectHelper::oh((QPDFObjectHelper *)&stack0xfffffffffffffe30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f0,
                 "QPDFFormFieldObjectHelper::setV called with need_appearances = true on an object that is not associated with an owning QPDF"
                 ,&local_1f1);
      qpdf_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&stack0xfffffffffffffe30,&local_1f0);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::allocator<char>::~allocator(&local_1f1);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xfffffffffffffe30);
      local_1c0._M_pi = qpdf_00;
      QPDFAcroFormDocumentHelper::QPDFAcroFormDocumentHelper(&local_218,(QPDF *)qpdf_00);
      QPDFAcroFormDocumentHelper::setNeedAppearances(&local_218,true);
      QPDFAcroFormDocumentHelper::~QPDFAcroFormDocumentHelper(&local_218);
    }
  }
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::setV(QPDFObjectHandle value, bool need_appearances)
{
    if (getFieldType() == "/Btn") {
        if (isCheckbox()) {
            bool okay = false;
            if (value.isName()) {
                std::string name = value.getName();
                okay = true;
                // Accept any value other than /Off to mean checked. Files have been seen that use
                // /1 or other values.
                setCheckBoxValue((name != "/Off"));
            }
            if (!okay) {
                oh().warnIfPossible(
                    "ignoring attempt to set a checkbox field to a value whose type is not name");
            }
        } else if (isRadioButton()) {
            if (value.isName()) {
                setRadioButtonValue(value);
            } else {
                oh().warnIfPossible(
                    "ignoring attempt to set a radio button field to an object that is not a name");
            }
        } else if (isPushbutton()) {
            oh().warnIfPossible("ignoring attempt set the value of a pushbutton field");
        }
        return;
    }
    if (value.isString()) {
        setFieldAttribute("/V", QPDFObjectHandle::newUnicodeString(value.getUTF8Value()));
    } else {
        setFieldAttribute("/V", value);
    }
    if (need_appearances) {
        QPDF& qpdf = oh().getQPDF(
            "QPDFFormFieldObjectHelper::setV called with need_appearances = "
            "true on an object that is not associated with an owning QPDF");
        QPDFAcroFormDocumentHelper(qpdf).setNeedAppearances(true);
    }
}